

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O0

int __thiscall
icu_63::Formattable::clone
          (Formattable *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Formattable *this_00;
  undefined8 local_30;
  Formattable *this_local;
  
  this_00 = (Formattable *)UMemory::operator_new((UMemory *)0x70,(size_t)__fn);
  local_30 = (Formattable *)0x0;
  if (this_00 != (Formattable *)0x0) {
    Formattable(this_00,this);
    local_30 = this_00;
  }
  return (int)local_30;
}

Assistant:

Formattable *
Formattable::clone() const {
    return new Formattable(*this);
}